

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

TPZGeoEl * __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticCube>::CreateBCGeoBlendEl
          (TPZGeoElRefLess<pzgeom::TPZQuadraticCube> *this,int side,int bc,TPZVec<int> *mapside)

{
  undefined8 uVar1;
  int iVar2;
  undefined4 uVar3;
  long lVar4;
  int *piVar5;
  long *plVar6;
  undefined4 extraout_var;
  TPZVec<int> *in_RCX;
  uint in_EDX;
  int in_ESI;
  TPZGeoEl *in_RDI;
  TPZGeoElSide newelside;
  TPZGeoElSide me;
  TPZGeoEl *newel;
  MElementType BCtype;
  TPZGeoMesh *mesh;
  int64_t index;
  int inode;
  TPZManVector<long,_10> nodeindices;
  int sidennodes;
  undefined8 in_stack_fffffffffffffec0;
  int side_00;
  TPZManVector<long,_10> *this_00;
  TPZGeoEl *in_stack_fffffffffffffec8;
  TPZGeoEl *gel;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  int64_t in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined1 local_f8 [184];
  TPZVec<int> *in_stack_ffffffffffffffc0;
  TPZGeoElSide *in_stack_ffffffffffffffc8;
  TPZGeoElSide *in_stack_ffffffffffffffd0;
  
  iVar2 = pztopology::TPZCube::NSideNodes(in_ESI);
  TPZManVector<long,_10>::TPZManVector
            ((TPZManVector<long,_10> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)
             ,in_stack_fffffffffffffed8);
  for (local_f8._100_4_ = 0; side_00 = (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),
      (int)local_f8._100_4_ < iVar2; local_f8._100_4_ = local_f8._100_4_ + 1) {
    lVar4 = (**(code **)(*(long *)in_RDI + 0x128))(in_RDI,in_ESI,local_f8._100_4_);
    piVar5 = TPZVec<int>::operator[](in_RCX,(long)(int)local_f8._100_4_);
    plVar6 = TPZVec<long>::operator[]((TPZVec<long> *)(local_f8 + 0x68),(long)*piVar5);
    *plVar6 = lVar4;
  }
  local_f8._64_8_ = TPZGeoEl::Mesh(in_RDI);
  local_f8._60_4_ = pztopology::TPZCube::Type(in_ESI);
  iVar2 = (*((TPZSavable *)local_f8._64_8_)->_vptr_TPZSavable[0xd])
                    (local_f8._64_8_,(ulong)(uint)local_f8._60_4_,local_f8 + 0x68,(ulong)in_EDX,
                     local_f8 + 0x48);
  local_f8._48_8_ = CONCAT44(extraout_var,iVar2);
  TPZGeoElSide::TPZGeoElSide
            ((TPZGeoElSide *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffec8,side_00);
  gel = (TPZGeoEl *)local_f8._48_8_;
  uVar3 = (**(code **)(*(long *)local_f8._48_8_ + 0xf0))();
  this_00 = (TPZManVector<long,_10> *)local_f8;
  TPZGeoElSide::TPZGeoElSide
            ((TPZGeoElSide *)CONCAT44(uVar3,in_stack_fffffffffffffed0),gel,
             (int)((ulong)this_00 >> 0x20));
  TPZGeoElSide::InsertConnectivity
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  (**(code **)(*(long *)local_f8._48_8_ + 0x78))();
  uVar1 = local_f8._48_8_;
  TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x17588d6);
  TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x17588e0);
  TPZManVector<long,_10>::~TPZManVector(this_00);
  return (TPZGeoEl *)uVar1;
}

Assistant:

TPZGeoEl *TPZGeoElRefLess<TGeo>::CreateBCGeoBlendEl(int side,int bc, const TPZVec<int> &mapside)
{
    int sidennodes = TGeo::NSideNodes(side);
    TPZManVector<int64_t> nodeindices(sidennodes);
    int inode;
    for(inode=0; inode<sidennodes; inode++){
        nodeindices[mapside[inode]] = this->SideNodeIndex(side,inode);
    }
    int64_t index;
    
    TPZGeoMesh *mesh = this->Mesh();
    MElementType BCtype = TGeo::Type(side);
    
    TPZGeoEl *newel = mesh->CreateGeoBlendElement(BCtype, nodeindices, bc, index);
    TPZGeoElSide me(this,side);
    TPZGeoElSide newelside(newel,newel->NSides()-1);
    
    newelside.InsertConnectivity(me,mapside);
    newel->Initialize();
    
    return newel;
}